

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.c
# Opt level: O3

stumpless_target * stumpless_open_stream_target(char *name,FILE *stream)

{
  stumpless_target *target;
  stream_target *psVar1;
  long lVar2;
  char *message;
  
  clear_error();
  if (name == (char *)0x0) {
    message = "name was NULL";
  }
  else {
    if (stream != (FILE *)0x0) {
      target = new_target(STUMPLESS_STREAM_TARGET,name);
      if (target == (stumpless_target *)0x0) {
        return (stumpless_target *)0x0;
      }
      psVar1 = new_stream_target(stream);
      target->id = psVar1;
      if (psVar1 == (stream_target *)0x0) {
        destroy_target(target);
        return (stumpless_target *)0x0;
      }
      lVar2 = 0;
      do {
        *(undefined1 *)((long)target->id + lVar2 + 8) = 0;
        lVar2 = lVar2 + 0x20;
      } while (lVar2 != 0x100);
      stumpless_set_current_target(target);
      return target;
    }
    message = "stream was NULL";
  }
  raise_argument_empty(message);
  return (stumpless_target *)0x0;
}

Assistant:

struct stumpless_target *
stumpless_open_stream_target( const char *name, FILE *stream ) {
  struct stumpless_target *target;

  clear_error(  );

  VALIDATE_ARG_NOT_NULL( name );
  VALIDATE_ARG_NOT_NULL( stream );

  target = new_target( STUMPLESS_STREAM_TARGET, name );

  if( !target ) {
    goto fail;
  }

  target->id = new_stream_target( stream );
  if( !target->id ) {
    goto fail_id;
  }

  for (unsigned short i = 0; i < 8; i++)
    ((struct stream_target *)(target->id))->escape_codes[i][0] = 0;

  stumpless_set_current_target( target );
  return target;

fail_id:
  destroy_target( target );
fail:
  return NULL;
}